

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O0

void pcs_free(PrimeCandidateSource *s)

{
  ulong local_18;
  size_t i;
  PrimeCandidateSource *s_local;
  
  mp_free(s->limit);
  mp_free(s->factor);
  mp_free(s->addend);
  for (local_18 = 0; local_18 < s->nkps; local_18 = local_18 + 1) {
    mp_free(s->kps[local_18]);
  }
  safefree(s->avoids);
  safefree(s->kps);
  safefree(s);
  return;
}

Assistant:

void pcs_free(PrimeCandidateSource *s)
{
    mp_free(s->limit);
    mp_free(s->factor);
    mp_free(s->addend);
    for (size_t i = 0; i < s->nkps; i++)
        mp_free(s->kps[i]);
    sfree(s->avoids);
    sfree(s->kps);
    sfree(s);
}